

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ProdItem * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::ProdItem,slang::ast::RandSeqProductionSymbol::ProdItem>
          (BumpAllocator *this,ProdItem *args)

{
  RandSeqProductionSymbol *pRVar1;
  pointer ppEVar2;
  size_t sVar3;
  undefined4 uVar4;
  ProdItem *pPVar5;
  
  pPVar5 = (ProdItem *)allocate(this,0x20,8);
  uVar4 = *(undefined4 *)&args->field_0x4;
  pRVar1 = args->target;
  ppEVar2 = (args->args)._M_ptr;
  sVar3 = (args->args)._M_extent._M_extent_value;
  pPVar5->super_ProdBase = (ProdBase)(args->super_ProdBase).kind;
  *(undefined4 *)&pPVar5->field_0x4 = uVar4;
  pPVar5->target = pRVar1;
  (pPVar5->args)._M_ptr = ppEVar2;
  (pPVar5->args)._M_extent._M_extent_value = sVar3;
  return pPVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }